

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int sort_5_3::merge_sort_5(int *a,int low,int high)

{
  int iVar1;
  undefined4 extraout_var;
  int *piVar2;
  int iVar3;
  int extraout_EDX;
  long lVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  undefined8 uStack_20;
  
  iVar3 = 2;
  iVar1 = merge_sort_5(a,low,(high + low) / 2);
  uStack_20 = CONCAT44(extraout_var,iVar1);
  piVar2 = (int *)((long)&uStack_20 -
                  ((ulong)((extraout_EDX - low) + 1) * 4 + 0xf & 0xfffffffffffffff0));
  lVar4 = (long)low;
  piVar6 = piVar2;
  for (lVar7 = lVar4; lVar7 <= extraout_EDX; lVar7 = lVar7 + 1) {
    *piVar6 = a[lVar7];
    piVar6 = piVar6 + 1;
  }
  iVar5 = iVar3 + 1;
  iVar1 = low;
  do {
    if (iVar3 < iVar1) {
      a[lVar4] = piVar2[iVar5 - low];
LAB_001030d5:
      iVar5 = iVar5 + 1;
    }
    else {
      if ((iVar5 <= extraout_EDX) && (piVar2[iVar5 - low] < piVar2[iVar1 - low])) {
        a[lVar4] = piVar2[iVar5 - low];
        goto LAB_001030d5;
      }
      a[lVar4] = piVar2[iVar1 - low];
      iVar1 = iVar1 + 1;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

int merge_sort_5(int *a, int low, int high) {
        if (low < high) {
            int m = (low + high) / 2;
            merge_sort_5(a, low, m);
            merge_sort_5(a, m + 1, high);
            merge_5(a, low, high, m);
        }
    }